

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O0

bool __thiscall xray_re::xr_file_system::initialize(xr_file_system *this,char *fs_spec,uint flags)

{
  bool bVar1;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  undefined1 local_50 [8];
  string folder;
  xr_reader *r;
  uint flags_local;
  char *fs_spec_local;
  xr_file_system *this_local;
  
  if ((fs_spec == (char *)0x0) || (*fs_spec == '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,PA_FS_ROOT,&local_d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"",&local_121);
    add_path_alias(this,&local_d0,&local_f8,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
  }
  else {
    folder.field_2._8_8_ = r_open(this,fs_spec);
    if ((xr_reader *)folder.field_2._8_8_ == (xr_reader *)0x0) {
      return false;
    }
    std::__cxx11::string::string((string *)local_50);
    split_path(fs_spec,(string *)local_50,(string *)0x0,(string *)0x0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,PA_FS_ROOT,&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
    add_path_alias(this,&local_80,(string *)local_50,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    bVar1 = parse_fs_spec(this,(xr_reader *)folder.field_2._8_8_);
    if (!bVar1) {
      std::
      vector<xray_re::xr_file_system::path_alias_*,_std::allocator<xray_re::xr_file_system::path_alias_*>_>
      ::clear(&this->m_aliases);
    }
    r_close(this,(xr_reader **)((long)&folder.field_2 + 8));
    std::__cxx11::string::~string((string *)local_50);
  }
  this->m_flags = flags;
  bVar1 = std::
          vector<xray_re::xr_file_system::path_alias_*,_std::allocator<xray_re::xr_file_system::path_alias_*>_>
          ::empty(&this->m_aliases);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool xr_file_system::initialize(const char* fs_spec, unsigned flags)
{
	if (fs_spec && fs_spec[0] != '\0') {
		xr_reader* r = r_open(fs_spec);
		if (r == 0)
			return false;
			
		std::string folder;
		split_path(fs_spec, &folder);
		add_path_alias(PA_FS_ROOT, folder, "");
		if (!parse_fs_spec(*r))
			this->m_aliases.clear();
		r_close(r);
	} else {
#if 0
		std::string folder;
		get_working_folder(folder);
#endif
		add_path_alias(PA_FS_ROOT, "", "");
	}
	m_flags = flags;
	return !m_aliases.empty();
}